

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::PrepareVisitor::internalVisit(PrepareVisitor *this,Atom *atom)

{
  bool bVar1;
  StuntDouble *in_RSI;
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::GenericData> data;
  string *in_stack_fffffffffffffeb8;
  StuntDouble *in_stack_fffffffffffffec0;
  StuntDouble *in_stack_fffffffffffffec8;
  shared_ptr<OpenMD::GenericData> *__r;
  StuntDouble *__a;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string local_f8 [55];
  undefined1 local_c1 [56];
  allocator<char> local_89;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [64];
  StuntDouble *local_10;
  
  local_10 = in_RSI;
  std::shared_ptr<OpenMD::GenericData>::shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34db14);
  __s = &local_51;
  __a = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)__s,(allocator<char> *)__a);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffec8,(string *)in_stack_fffffffffffffec0);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffec0,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffeb8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34db8c);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,(char *)__s,(allocator<char> *)__a);
    StuntDouble::removeProperty(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  __r = (shared_ptr<OpenMD::GenericData> *)local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)__s,(allocator<char> *)__a);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffec8,(string *)in_stack_fffffffffffffec0);
  std::shared_ptr<OpenMD::GenericData>::operator=
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffec0,
             (shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffeb8);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34dd37);
  std::__cxx11::string::~string((string *)(local_c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_c1);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>(__r);
    bVar1 = std::operator!=((shared_ptr<OpenMD::AtomData> *)in_stack_fffffffffffffec0,
                            in_stack_fffffffffffffeb8);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff00,(char *)__s,(allocator<char> *)__a);
      StuntDouble::removeProperty(local_10,in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
    }
    std::shared_ptr<OpenMD::AtomData>::~shared_ptr((shared_ptr<OpenMD::AtomData> *)0x34de8c);
  }
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x34de99);
  return;
}

Assistant:

void PrepareVisitor::internalVisit(Atom* atom) {
    std::shared_ptr<GenericData> data;

    // if visited property is  existed, remove it
    data = atom->getPropertyByName("VISITED");

    if (data != nullptr) { atom->removeProperty("VISITED"); }

    // remove atomdata
    data = atom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      std::shared_ptr<AtomData> atomData =
          std::dynamic_pointer_cast<AtomData>(data);

      if (atomData != NULL) atom->removeProperty("ATOMDATA");
    }
  }